

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_78::BinaryReaderIR::PushLabel
          (BinaryReaderIR *this,LabelType label_type,ExprList *first,Expr *context)

{
  Expr *local_28;
  Expr *context_local;
  ExprList *first_local;
  BinaryReaderIR *pBStack_10;
  LabelType label_type_local;
  BinaryReaderIR *this_local;
  
  local_28 = context;
  context_local = (Expr *)first;
  first_local._4_4_ = label_type;
  pBStack_10 = this;
  std::
  vector<wabt::(anonymous_namespace)::LabelNode,std::allocator<wabt::(anonymous_namespace)::LabelNode>>
  ::emplace_back<wabt::LabelType&,wabt::intrusive_list<wabt::Expr>*&,wabt::Expr*&>
            ((vector<wabt::(anonymous_namespace)::LabelNode,std::allocator<wabt::(anonymous_namespace)::LabelNode>>
              *)&this->label_stack_,(LabelType *)((long)&first_local + 4),
             (intrusive_list<wabt::Expr> **)&context_local,&local_28);
  return;
}

Assistant:

void BinaryReaderIR::PushLabel(LabelType label_type,
                               ExprList* first,
                               Expr* context) {
  label_stack_.emplace_back(label_type, first, context);
}